

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copy_csv.cpp
# Opt level: O3

vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
* duckdb::CreateCastExpressions
            (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             *__return_storage_ptr__,WriteCSVData *bind_data,ClientContext *context,
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            *names,vector<duckdb::LogicalType,_true> *sql_types)

{
  shared_ptr<duckdb::ExtraTypeInfo,_true> *psVar1;
  LogicalTypeId LVar2;
  undefined1 auVar3 [8];
  pointer puVar4;
  element_type *peVar5;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  mapped_type *pmVar7;
  Binder *pBVar8;
  Binder *this;
  idx_t index;
  const_reference args_1;
  const_reference args;
  BoundExpression *pBVar9;
  ConstantExpression *pCVar10;
  type binder_00;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  *extraout_RAX;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  *extraout_RAX_00;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  *pvVar11;
  optional_ptr<duckdb::LogicalType,_true> result_type;
  pointer *__ptr;
  map<duckdb::LogicalTypeId,_duckdb::Value,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::Value>_>_>
  *this_00;
  bool bVar12;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
  children;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
  unbound_expressions;
  shared_ptr<duckdb::Binder,_true> binder;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> local_118;
  char local_10a;
  char local_109;
  ConstantExpression *local_108;
  unsigned_long local_100;
  undefined1 local_f8 [8];
  element_type *peStack_f0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_e8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_e0;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  local_d8;
  ClientContext *local_b8;
  ExpressionBinder local_b0;
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_40;
  ClientContext *local_38;
  
  this_00 = &(bind_data->super_BaseCSVData).options.write_date_format;
  local_b0._vptr_ExpressionBinder._0_1_ = 0xf;
  local_e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)__return_storage_ptr__;
  pmVar7 = ::std::
           map<duckdb::LogicalTypeId,_duckdb::Value,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::Value>_>_>
           ::operator[](this_00,(key_type *)&local_b0);
  local_10a = pmVar7->is_null;
  local_b0._vptr_ExpressionBinder =
       (_func_int **)CONCAT71(local_b0._vptr_ExpressionBinder._1_7_,0x13);
  local_b8 = (ClientContext *)this_00;
  pmVar7 = ::std::
           map<duckdb::LogicalTypeId,_duckdb::Value,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::Value>_>_>
           ::operator[](this_00,(key_type *)&local_b0);
  local_109 = pmVar7->is_null;
  local_38 = context;
  Binder::CreateBinder
            ((Binder *)&stack0xffffffffffffffb8,context,(optional_ptr<duckdb::Binder,_true>)0x0,
             REGULAR_BINDER);
  pBVar8 = shared_ptr<duckdb::Binder,_true>::operator->
                     ((shared_ptr<duckdb::Binder,_true> *)&stack0xffffffffffffffb8);
  this = shared_ptr<duckdb::Binder,_true>::operator->
                   ((shared_ptr<duckdb::Binder,_true> *)&stack0xffffffffffffffb8);
  index = Binder::GenerateTableIndex(this);
  psVar1 = &local_b0.target_type.type_info_;
  local_b0._vptr_ExpressionBinder = (_func_int **)psVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"copy_csv","");
  BindContext::AddGenericBinding(&pBVar8->bind_context,index,(string *)&local_b0,names,sql_types);
  if ((shared_ptr<duckdb::ExtraTypeInfo,_true> *)local_b0._vptr_ExpressionBinder != psVar1) {
    operator_delete(local_b0._vptr_ExpressionBinder);
  }
  local_d8.
  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d8.
  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8.
  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_100 = 0;
  if ((sql_types->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (sql_types->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
      super__Vector_impl_data._M_start) {
    do {
      args_1 = vector<duckdb::LogicalType,_true>::operator[](sql_types,local_100);
      args = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
             ::operator[](names,local_100);
      LVar2 = args_1->id_;
      bVar12 = true;
      if (((LVar2 == TIMESTAMP) || (bVar12 = LVar2 == TIMESTAMP_TZ, LVar2 != DATE)) ||
         (local_10a != '\0')) {
        if ((local_109 == '\0') && (bVar12)) {
          local_f8 = (undefined1  [8])0x0;
          peStack_f0 = (element_type *)0x0;
          local_e8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          make_uniq<duckdb::BoundReferenceExpression,std::__cxx11::string_const&,duckdb::LogicalType_const&,unsigned_long&>
                    ((duckdb *)&local_108,args,args_1,&local_100);
          pBVar9 = (BoundExpression *)operator_new(0x40);
          local_b0._vptr_ExpressionBinder = (_func_int **)local_108;
          local_108 = (ConstantExpression *)0x0;
          BoundExpression::BoundExpression
                    (pBVar9,(unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                             *)&local_b0);
          if ((ConstantExpression *)local_b0._vptr_ExpressionBinder != (ConstantExpression *)0x0) {
            (*(((ParsedExpression *)local_b0._vptr_ExpressionBinder)->super_BaseExpression).
              _vptr_BaseExpression[1])();
          }
          local_118._M_head_impl = (ParsedExpression *)pBVar9;
          ::std::
          vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
          ::
          emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                    ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                      *)local_f8,
                     (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                      *)&local_118);
          if ((BoundExpression *)local_118._M_head_impl != (BoundExpression *)0x0) {
            (*((BaseExpression *)
              &((local_118._M_head_impl)->super_BaseExpression)._vptr_BaseExpression)->
              _vptr_BaseExpression[1])();
          }
          local_118._M_head_impl = (ParsedExpression *)0x0;
          if (local_108 != (ConstantExpression *)0x0) {
            (*(local_108->super_ParsedExpression).super_BaseExpression._vptr_BaseExpression[1])();
          }
          local_108 = (ConstantExpression *)CONCAT71(local_108._1_7_,0x13);
          pmVar7 = ::std::
                   map<duckdb::LogicalTypeId,_duckdb::Value,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::Value>_>_>
                   ::operator[]((map<duckdb::LogicalTypeId,_duckdb::Value,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::Value>_>_>
                                 *)local_b8,(key_type *)&local_108);
          pCVar10 = (ConstantExpression *)operator_new(0x78);
          Value::Value((Value *)&local_b0,pmVar7);
          ConstantExpression::ConstantExpression(pCVar10,(Value *)&local_b0);
          Value::~Value((Value *)&local_b0);
          local_118._M_head_impl = (ParsedExpression *)pCVar10;
          ::std::
          vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
          ::
          emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                    ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                      *)local_f8,
                     (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                      *)&local_118);
          if ((ConstantExpression *)local_118._M_head_impl != (ConstantExpression *)0x0) {
            (*((BaseExpression *)
              &((local_118._M_head_impl)->super_BaseExpression)._vptr_BaseExpression)->
              _vptr_BaseExpression[1])();
          }
          make_uniq_base<duckdb::ParsedExpression,duckdb::FunctionExpression,char_const(&)[9],duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,true>>
                    ((duckdb *)&local_b0,(char (*) [9])0x1dfbb13,
                     (vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                      *)local_f8);
          ::std::
          vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
          ::
          emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                    ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                      *)&local_d8,
                     (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                      *)&local_b0);
          goto LAB_01537228;
        }
        make_uniq<duckdb::BoundReferenceExpression,std::__cxx11::string_const&,duckdb::LogicalType_const&,unsigned_long&>
                  ((duckdb *)&local_118,args,args_1,&local_100);
        pBVar9 = (BoundExpression *)operator_new(0x40);
        local_b0._vptr_ExpressionBinder = (_func_int **)local_118._M_head_impl;
        local_118._M_head_impl = (ParsedExpression *)0x0;
        BoundExpression::BoundExpression
                  (pBVar9,(unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                           *)&local_b0);
        local_f8 = (undefined1  [8])pBVar9;
        if ((ConstantExpression *)local_b0._vptr_ExpressionBinder != (ConstantExpression *)0x0) {
          (*(((ParsedExpression *)local_b0._vptr_ExpressionBinder)->super_BaseExpression).
            _vptr_BaseExpression[1])();
        }
        if ((ConstantExpression *)local_118._M_head_impl != (ConstantExpression *)0x0) {
          (*((BaseExpression *)
            &((local_118._M_head_impl)->super_BaseExpression)._vptr_BaseExpression)->
            _vptr_BaseExpression[1])();
        }
        make_uniq_base<duckdb::ParsedExpression,duckdb::CastExpression,duckdb::LogicalTypeId_const&,duckdb::unique_ptr<duckdb::BoundExpression,std::default_delete<duckdb::BoundExpression>,true>>
                  ((duckdb *)&local_b0,&LogicalType::VARCHAR,
                   (unique_ptr<duckdb::BoundExpression,_std::default_delete<duckdb::BoundExpression>,_true>
                    *)local_f8);
        ::std::
        vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                    *)&local_d8,
                   (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    *)&local_b0);
        if ((ConstantExpression *)local_b0._vptr_ExpressionBinder != (ConstantExpression *)0x0) {
          (*(((ParsedExpression *)local_b0._vptr_ExpressionBinder)->super_BaseExpression).
            _vptr_BaseExpression[1])();
        }
        if (local_f8 != (undefined1  [8])0x0) {
          (*(((ParsedExpression *)local_f8)->super_BaseExpression)._vptr_BaseExpression[1])();
        }
      }
      else {
        local_f8 = (undefined1  [8])0x0;
        peStack_f0 = (element_type *)0x0;
        local_e8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        make_uniq<duckdb::BoundReferenceExpression,std::__cxx11::string_const&,duckdb::LogicalType_const&,unsigned_long&>
                  ((duckdb *)&local_108,args,args_1,&local_100);
        pBVar9 = (BoundExpression *)operator_new(0x40);
        local_b0._vptr_ExpressionBinder = (_func_int **)local_108;
        local_108 = (ConstantExpression *)0x0;
        BoundExpression::BoundExpression
                  (pBVar9,(unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                           *)&local_b0);
        if ((ConstantExpression *)local_b0._vptr_ExpressionBinder != (ConstantExpression *)0x0) {
          (*(((ParsedExpression *)local_b0._vptr_ExpressionBinder)->super_BaseExpression).
            _vptr_BaseExpression[1])();
        }
        local_118._M_head_impl = (ParsedExpression *)pBVar9;
        ::std::
        vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                    *)local_f8,
                   (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    *)&local_118);
        if ((BoundExpression *)local_118._M_head_impl != (BoundExpression *)0x0) {
          (*((BaseExpression *)
            &((local_118._M_head_impl)->super_BaseExpression)._vptr_BaseExpression)->
            _vptr_BaseExpression[1])();
        }
        local_118._M_head_impl = (ParsedExpression *)0x0;
        if (local_108 != (ConstantExpression *)0x0) {
          (*(local_108->super_ParsedExpression).super_BaseExpression._vptr_BaseExpression[1])();
        }
        local_108 = (ConstantExpression *)CONCAT71(local_108._1_7_,0xf);
        pmVar7 = ::std::
                 map<duckdb::LogicalTypeId,_duckdb::Value,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::Value>_>_>
                 ::operator[]((map<duckdb::LogicalTypeId,_duckdb::Value,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::Value>_>_>
                               *)local_b8,(key_type *)&local_108);
        pCVar10 = (ConstantExpression *)operator_new(0x78);
        Value::Value((Value *)&local_b0,pmVar7);
        ConstantExpression::ConstantExpression(pCVar10,(Value *)&local_b0);
        Value::~Value((Value *)&local_b0);
        local_118._M_head_impl = (ParsedExpression *)pCVar10;
        ::std::
        vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                    *)local_f8,
                   (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    *)&local_118);
        if ((ConstantExpression *)local_118._M_head_impl != (ConstantExpression *)0x0) {
          (*((BaseExpression *)
            &((local_118._M_head_impl)->super_BaseExpression)._vptr_BaseExpression)->
            _vptr_BaseExpression[1])();
        }
        make_uniq_base<duckdb::ParsedExpression,duckdb::FunctionExpression,char_const(&)[9],duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,true>>
                  ((duckdb *)&local_b0,(char (*) [9])0x1dfbb13,
                   (vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                    *)local_f8);
        ::std::
        vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                    *)&local_d8,
                   (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    *)&local_b0);
LAB_01537228:
        if ((ConstantExpression *)local_b0._vptr_ExpressionBinder != (ConstantExpression *)0x0) {
          (*(((ParsedExpression *)local_b0._vptr_ExpressionBinder)->super_BaseExpression).
            _vptr_BaseExpression[1])();
        }
        ::std::
        vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
        ::~vector((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                   *)local_f8);
      }
      local_100 = local_100 + 1;
    } while (local_100 <
             (ulong)(((long)(sql_types->
                            super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>)
                            .
                            super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(sql_types->
                            super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>)
                            .
                            super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555));
  }
  (((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
     *)&(local_e0._M_pi)->_vptr__Sp_counted_base)->
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)&(local_e0._M_pi)->_M_use_count = (pointer)0x0;
  local_e0._M_pi[1]._vptr__Sp_counted_base = (_func_int **)0x0;
  binder_00 = shared_ptr<duckdb::Binder,_true>::operator*
                        ((shared_ptr<duckdb::Binder,_true> *)&stack0xffffffffffffffb8);
  ExpressionBinder::ExpressionBinder(&local_b0,binder_00,local_38,false);
  LogicalType::LogicalType((LogicalType *)local_f8,VARCHAR);
  _Var6._M_pi = local_b0.target_type.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi;
  peVar5 = local_b0.target_type.type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  auVar3 = local_f8;
  local_b0.target_type.id_ = local_f8[0];
  local_b0.target_type.physical_type_ = local_f8[1];
  local_b0.target_type.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peStack_f0;
  local_b0.target_type.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_e8._M_pi;
  peStack_f0 = peVar5;
  local_e8._M_pi = _Var6._M_pi;
  local_f8 = auVar3;
  LogicalType::~LogicalType((LogicalType *)local_f8);
  puVar4 = local_d8.
           super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (local_d8.
      super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_d8.
      super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    result_type.ptr =
         (LogicalType *)
         local_d8.
         super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    do {
      ExpressionBinder::Bind
                ((ExpressionBinder *)local_f8,
                 (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  *)&local_b0,result_type,false);
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                  *)local_e0._M_pi,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 local_f8);
      if (local_f8 != (undefined1  [8])0x0) {
        (*(((ParsedExpression *)local_f8)->super_BaseExpression)._vptr_BaseExpression[1])();
      }
      result_type.ptr = (LogicalType *)&(result_type.ptr)->type_info_;
    } while (result_type.ptr != (LogicalType *)puVar4);
  }
  ExpressionBinder::~ExpressionBinder(&local_b0);
  ::std::
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ::~vector(&local_d8);
  pvVar11 = extraout_RAX;
  if (local_40._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_40._M_pi);
    pvVar11 = extraout_RAX_00;
  }
  return pvVar11;
}

Assistant:

static vector<unique_ptr<Expression>> CreateCastExpressions(WriteCSVData &bind_data, ClientContext &context,
                                                            const vector<string> &names,
                                                            const vector<LogicalType> &sql_types) {
	auto &options = bind_data.options;
	auto &formats = options.write_date_format;

	bool has_dateformat = !formats[LogicalTypeId::DATE].IsNull();
	bool has_timestampformat = !formats[LogicalTypeId::TIMESTAMP].IsNull();

	// Create a binder
	auto binder = Binder::CreateBinder(context);

	auto &bind_context = binder->bind_context;
	auto table_index = binder->GenerateTableIndex();
	bind_context.AddGenericBinding(table_index, "copy_csv", names, sql_types);

	// Create the ParsedExpressions (cast, strftime, etc..)
	vector<unique_ptr<ParsedExpression>> unbound_expressions;
	for (idx_t i = 0; i < sql_types.size(); i++) {
		auto &type = sql_types[i];
		auto &name = names[i];

		bool is_timestamp = type.id() == LogicalTypeId::TIMESTAMP || type.id() == LogicalTypeId::TIMESTAMP_TZ;
		if (has_dateformat && type.id() == LogicalTypeId::DATE) {
			// strftime(<name>, 'format')
			vector<unique_ptr<ParsedExpression>> children;
			children.push_back(make_uniq<BoundExpression>(make_uniq<BoundReferenceExpression>(name, type, i)));
			children.push_back(make_uniq<ConstantExpression>(formats[LogicalTypeId::DATE]));
			auto func = make_uniq_base<ParsedExpression, FunctionExpression>("strftime", std::move(children));
			unbound_expressions.push_back(std::move(func));
		} else if (has_timestampformat && is_timestamp) {
			// strftime(<name>, 'format')
			vector<unique_ptr<ParsedExpression>> children;
			children.push_back(make_uniq<BoundExpression>(make_uniq<BoundReferenceExpression>(name, type, i)));
			children.push_back(make_uniq<ConstantExpression>(formats[LogicalTypeId::TIMESTAMP]));
			auto func = make_uniq_base<ParsedExpression, FunctionExpression>("strftime", std::move(children));
			unbound_expressions.push_back(std::move(func));
		} else {
			// CAST <name> AS VARCHAR
			auto column = make_uniq<BoundExpression>(make_uniq<BoundReferenceExpression>(name, type, i));
			auto expr = make_uniq_base<ParsedExpression, CastExpression>(LogicalType::VARCHAR, std::move(column));
			unbound_expressions.push_back(std::move(expr));
		}
	}

	// Create an ExpressionBinder, bind the Expressions
	vector<unique_ptr<Expression>> expressions;
	ExpressionBinder expression_binder(*binder, context);
	expression_binder.target_type = LogicalType::VARCHAR;
	for (auto &expr : unbound_expressions) {
		expressions.push_back(expression_binder.Bind(expr));
	}

	return expressions;
}